

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGenerator::AddGlobalTarget_PackageSource
          (cmGlobalGenerator *this,
          vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
          *targets)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  cmMakefile *this_00;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  char *pcVar7;
  string *__x;
  string configFile;
  cmCustomCommandLine singleLine;
  string relConfigFile;
  GlobalTargetInfo gti;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
  *local_f0;
  value_type local_e8;
  value_type local_c8;
  
  this_00 = *(this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  iVar6 = (*this->_vptr_cmGlobalGenerator[0x1a])();
  pcVar7 = (char *)CONCAT44(extraout_var,iVar6);
  if (pcVar7 != (char *)0x0) {
    local_c8.Name._M_dataplus._M_p = (pointer)&local_c8.Name.field_2;
    local_c8.Name._M_string_length = 0;
    local_c8.Name.field_2._M_local_buf[0] = '\0';
    paVar2 = &local_c8.Message.field_2;
    local_c8.Message._M_string_length = 0;
    local_c8.Message.field_2._M_local_buf[0] = '\0';
    paVar3 = &local_c8.WorkingDir.field_2;
    local_c8.CommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.CommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.CommandLines.super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.Depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.Depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.Depends.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.WorkingDir._M_string_length = 0;
    local_c8.WorkingDir.field_2._M_local_buf[0] = '\0';
    local_c8.UsesTerminal = false;
    local_f0 = targets;
    local_c8.Message._M_dataplus._M_p = (pointer)paVar2;
    local_c8.WorkingDir._M_dataplus._M_p = (pointer)paVar3;
    strlen(pcVar7);
    std::__cxx11::string::_M_replace((ulong)&local_c8,0,(char *)0x0,(ulong)pcVar7);
    std::__cxx11::string::_M_replace
              ((ulong)&local_c8.Message,0,(char *)local_c8.Message._M_string_length,0x54a981);
    pcVar7 = cmMakefile::GetCurrentBinaryDirectory(this_00);
    sVar4 = local_c8.WorkingDir._M_string_length;
    strlen(pcVar7);
    std::__cxx11::string::_M_replace((ulong)&local_c8.WorkingDir,0,(char *)sVar4,(ulong)pcVar7);
    local_c8.UsesTerminal = true;
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_108.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __x = cmSystemTools::GetCPackCommand_abi_cxx11_();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_108,__x);
    paVar1 = &local_128.field_2;
    local_128._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"--config","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_108,
               &local_128);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar1) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    pcVar7 = cmMakefile::GetCurrentBinaryDirectory(this_00);
    std::__cxx11::string::string((string *)&local_128,pcVar7,(allocator *)&local_e8);
    std::__cxx11::string::append((char *)&local_128);
    local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e8,"./CPackSourceConfig.cmake","");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_108,&local_e8);
    bVar5 = cmsys::SystemTools::FileExists(local_128._M_dataplus._M_p);
    if (bVar5) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_108,&local_128);
      std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::push_back
                (&local_c8.CommandLines.
                  super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>,
                 (value_type *)&local_108);
      std::
      vector<cmGlobalGenerator::GlobalTargetInfo,_std::allocator<cmGlobalGenerator::GlobalTargetInfo>_>
      ::push_back(local_f0,&local_c8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != paVar1) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.WorkingDir._M_dataplus._M_p != paVar3) {
      operator_delete(local_c8.WorkingDir._M_dataplus._M_p,
                      CONCAT71(local_c8.WorkingDir.field_2._M_allocated_capacity._1_7_,
                               local_c8.WorkingDir.field_2._M_local_buf[0]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c8.Depends);
    std::vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>::~vector
              (&local_c8.CommandLines.
                super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.Message._M_dataplus._M_p != paVar2) {
      operator_delete(local_c8.Message._M_dataplus._M_p,
                      CONCAT71(local_c8.Message.field_2._M_allocated_capacity._1_7_,
                               local_c8.Message.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8.Name._M_dataplus._M_p != &local_c8.Name.field_2) {
      operator_delete(local_c8.Name._M_dataplus._M_p,
                      CONCAT71(local_c8.Name.field_2._M_allocated_capacity._1_7_,
                               local_c8.Name.field_2._M_local_buf[0]) + 1);
    }
  }
  return;
}

Assistant:

void cmGlobalGenerator::AddGlobalTarget_PackageSource(
  std::vector<GlobalTargetInfo>& targets)
{
  cmMakefile* mf = this->Makefiles[0];
  const char* packageSourceTargetName = this->GetPackageSourceTargetName();
  if (packageSourceTargetName) {
    GlobalTargetInfo gti;
    gti.Name = packageSourceTargetName;
    gti.Message = "Run CPack packaging tool for source...";
    gti.WorkingDir = mf->GetCurrentBinaryDirectory();
    gti.UsesTerminal = true;
    cmCustomCommandLine singleLine;
    singleLine.push_back(cmSystemTools::GetCPackCommand());
    singleLine.push_back("--config");
    std::string configFile = mf->GetCurrentBinaryDirectory();
    configFile += "/CPackSourceConfig.cmake";
    std::string relConfigFile = "./CPackSourceConfig.cmake";
    singleLine.push_back(relConfigFile);
    if (cmSystemTools::FileExists(configFile.c_str())) {
      singleLine.push_back(configFile);
      gti.CommandLines.push_back(singleLine);
      targets.push_back(gti);
    }
  }
}